

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float fVar2;
  BBox1f BVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  ulong uVar12;
  BBox3fa *pBVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  size_t itime;
  ulong uVar17;
  unsigned_long uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar45;
  float fVar48;
  float fVar51;
  float fVar52;
  undefined1 auVar49 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar50;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  size_t local_168;
  size_t local_160;
  anon_class_16_2_07cfa4d6 local_148;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  PrimRef *local_100;
  PrimInfo *local_f8;
  ulong local_f0;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  auVar35 = _DAT_01f45a30;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = _DAT_01f45a30;
  auVar40 = _DAT_01f45a40;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = _DAT_01f45a40;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
   m128 = auVar35;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = auVar40;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  fVar41 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           super_Geometry.time_range.lower;
  fVar2 = time_range->lower;
  if (time_range->lower <= fVar41) {
    fVar2 = fVar41;
  }
  fVar41 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           super_Geometry.time_range.upper;
  if (time_range->upper <= fVar41) {
    fVar41 = time_range->upper;
  }
  if (fVar2 <= fVar41) {
    uVar18 = r->_begin;
    local_160 = 0;
    local_128 = auVar40;
    local_138 = auVar35;
    local_168 = k;
    local_100 = prims;
    local_f8 = __return_storage_ptr__;
    for (; uVar18 < r->_end; uVar18 = uVar18 + 1) {
      BVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry
              .super_Geometry.time_range;
      fVar22 = BVar3.lower;
      fVar43 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.super_Geometry.fnumTimeSegments;
      fVar37 = BVar3.upper - fVar22;
      fVar19 = ceilf(((fVar41 - fVar22) / fVar37) * 0.99999976 * fVar43);
      uVar4 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar18);
      uVar17 = (ulong)(uVar4 + 1);
      pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.vertices.items;
      if (uVar17 < (pBVar5->super_RawBufferView).num) {
        if (fVar43 <= fVar19) {
          fVar19 = fVar43;
        }
        fVar20 = (fVar2 - fVar22) / fVar37;
        fVar21 = floorf(fVar20 * 1.0000002 * fVar43);
        fVar38 = 0.0;
        if (0.0 <= fVar21) {
          fVar38 = fVar21;
        }
        pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.tangents.items;
        lVar14 = (long)(int)fVar38 * 0x38 + 0x10;
        uVar12 = (long)(int)fVar38 - 1;
LAB_00226b92:
        uVar12 = uVar12 + 1;
        if ((ulong)(long)(int)fVar19 < uVar12) {
          local_148.primID = &local_f0;
          fVar37 = (fVar41 - fVar22) / fVar37;
          fVar38 = fVar43 * fVar37;
          local_148.this = this;
          local_f0 = uVar18;
          fVar19 = floorf(fVar43 * fVar20);
          fVar22 = ceilf(fVar38);
          local_118 = (float)(int)fVar19;
          if (fVar19 <= 0.0) {
            fVar19 = 0.0;
          }
          fVar21 = fVar22;
          if (fVar43 <= fVar22) {
            fVar21 = fVar43;
          }
          fVar42 = -NAN;
          if (-1 < (int)local_118) {
            fVar42 = local_118;
          }
          iVar15 = (int)fVar43 + 1;
          if ((int)fVar22 < (int)fVar43 + 1) {
            iVar15 = (int)fVar22;
          }
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_148,(long)(int)fVar19);
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_148,(long)(int)fVar21);
          fVar22 = fVar43 * fVar20 - fVar19;
          if (iVar15 - (int)fVar42 == 1) {
            if (fVar22 <= 0.0) {
              fVar22 = 0.0;
            }
            fVar43 = 1.0 - fVar22;
            auVar49._0_4_ =
                 fVar43 * blower0.lower.field_0.m128[0] + fVar22 * bupper1.lower.field_0.m128[0];
            auVar49._4_4_ =
                 fVar43 * blower0.lower.field_0.m128[1] + fVar22 * bupper1.lower.field_0.m128[1];
            auVar49._8_4_ =
                 fVar43 * blower0.lower.field_0.m128[2] + fVar22 * bupper1.lower.field_0.m128[2];
            auVar49._12_4_ =
                 fVar43 * blower0.lower.field_0.m128[3] + fVar22 * bupper1.lower.field_0.m128[3];
            auVar44._0_4_ =
                 fVar43 * blower0.upper.field_0.m128[0] + fVar22 * bupper1.upper.field_0.m128[0];
            auVar44._4_4_ =
                 fVar43 * blower0.upper.field_0.m128[1] + fVar22 * bupper1.upper.field_0.m128[1];
            auVar44._8_4_ =
                 fVar43 * blower0.upper.field_0.m128[2] + fVar22 * bupper1.upper.field_0.m128[2];
            auVar44._12_4_ =
                 fVar43 * blower0.upper.field_0.m128[3] + fVar22 * bupper1.upper.field_0.m128[3];
            fVar21 = fVar21 - fVar38;
            if (fVar21 <= 0.0) {
              fVar21 = 0.0;
            }
            fVar43 = 1.0 - fVar21;
            fVar54 = bupper1.lower.field_0.m128[0] * fVar43 + blower0.lower.field_0.m128[0] * fVar21
            ;
            fVar55 = bupper1.lower.field_0.m128[1] * fVar43 + blower0.lower.field_0.m128[1] * fVar21
            ;
            fVar56 = bupper1.lower.field_0.m128[2] * fVar43 + blower0.lower.field_0.m128[2] * fVar21
            ;
            fVar57 = bupper1.lower.field_0.m128[3] * fVar43 + blower0.lower.field_0.m128[3] * fVar21
            ;
            fVar19 = fVar43 * bupper1.upper.field_0.m128[0] + fVar21 * blower0.upper.field_0.m128[0]
            ;
            fVar38 = fVar43 * bupper1.upper.field_0.m128[1] + fVar21 * blower0.upper.field_0.m128[1]
            ;
            fVar42 = fVar43 * bupper1.upper.field_0.m128[2] + fVar21 * blower0.upper.field_0.m128[2]
            ;
            fVar22 = fVar43 * bupper1.upper.field_0.m128[3] + fVar21 * blower0.upper.field_0.m128[3]
            ;
            uVar11 = 1;
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&blower1,&local_148,(long)((int)fVar19 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&bupper0,&local_148,(long)((int)fVar21 + -1));
            if (fVar22 <= 0.0) {
              fVar22 = 0.0;
            }
            fVar19 = 1.0 - fVar22;
            auVar49._0_4_ =
                 blower0.lower.field_0.m128[0] * fVar19 + blower1.lower.field_0.m128[0] * fVar22;
            auVar49._4_4_ =
                 blower0.lower.field_0.m128[1] * fVar19 + blower1.lower.field_0.m128[1] * fVar22;
            auVar49._8_4_ =
                 blower0.lower.field_0.m128[2] * fVar19 + blower1.lower.field_0.m128[2] * fVar22;
            auVar49._12_4_ =
                 blower0.lower.field_0.m128[3] * fVar19 + blower1.lower.field_0.m128[3] * fVar22;
            auVar44._0_4_ =
                 fVar19 * blower0.upper.field_0.m128[0] + fVar22 * blower1.upper.field_0.m128[0];
            auVar44._4_4_ =
                 fVar19 * blower0.upper.field_0.m128[1] + fVar22 * blower1.upper.field_0.m128[1];
            auVar44._8_4_ =
                 fVar19 * blower0.upper.field_0.m128[2] + fVar22 * blower1.upper.field_0.m128[2];
            auVar44._12_4_ =
                 fVar19 * blower0.upper.field_0.m128[3] + fVar22 * blower1.upper.field_0.m128[3];
            fVar21 = fVar21 - fVar38;
            if (fVar21 <= 0.0) {
              fVar21 = 0.0;
            }
            fVar22 = 1.0 - fVar21;
            fVar54 = bupper1.lower.field_0.m128[0] * fVar22 + bupper0.lower.field_0.m128[0] * fVar21
            ;
            fVar55 = bupper1.lower.field_0.m128[1] * fVar22 + bupper0.lower.field_0.m128[1] * fVar21
            ;
            fVar56 = bupper1.lower.field_0.m128[2] * fVar22 + bupper0.lower.field_0.m128[2] * fVar21
            ;
            fVar57 = bupper1.lower.field_0.m128[3] * fVar22 + bupper0.lower.field_0.m128[3] * fVar21
            ;
            fVar19 = fVar22 * bupper1.upper.field_0.m128[0] + fVar21 * bupper0.upper.field_0.m128[0]
            ;
            fVar38 = fVar22 * bupper1.upper.field_0.m128[1] + fVar21 * bupper0.upper.field_0.m128[1]
            ;
            fVar42 = fVar22 * bupper1.upper.field_0.m128[2] + fVar21 * bupper0.upper.field_0.m128[2]
            ;
            fVar22 = fVar22 * bupper1.upper.field_0.m128[3] + fVar21 * bupper0.upper.field_0.m128[3]
            ;
            pBVar13 = (BBox3fa *)(ulong)(uint)local_118;
            if ((int)local_118 < 0) {
              pBVar13 = (BBox3fa *)0xffffffff;
            }
            itime = (size_t)(int)pBVar13;
            while( true ) {
              itime = itime + 1;
              uVar11 = SUB84(pBVar13,0);
              if ((long)iVar15 <= (long)itime) break;
              fVar21 = ((float)(int)itime / fVar43 - fVar20) / (fVar37 - fVar20);
              fVar39 = 1.0 - fVar21;
              fVar51 = auVar49._4_4_;
              fVar52 = auVar49._8_4_;
              fVar53 = auVar49._12_4_;
              local_118 = auVar49._0_4_ * fVar39 + fVar54 * fVar21;
              fStack_114 = fVar51 * fVar39 + fVar55 * fVar21;
              fStack_110 = fVar52 * fVar39 + fVar56 * fVar21;
              fStack_10c = fVar53 * fVar39 + fVar57 * fVar21;
              fVar46 = auVar44._4_4_;
              fVar47 = auVar44._8_4_;
              fVar48 = auVar44._12_4_;
              pBVar13 = linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_148,itime);
              auVar30._0_4_ = bi.lower.field_0.m128[0] - local_118;
              auVar30._4_4_ = bi.lower.field_0.m128[1] - fStack_114;
              auVar30._8_4_ = bi.lower.field_0.m128[2] - fStack_110;
              auVar30._12_4_ = bi.lower.field_0.m128[3] - fStack_10c;
              auVar36._0_4_ = bi.upper.field_0.m128[0] - (fVar39 * auVar44._0_4_ + fVar21 * fVar19);
              auVar36._4_4_ = bi.upper.field_0.m128[1] - (fVar39 * fVar46 + fVar21 * fVar38);
              auVar36._8_4_ = bi.upper.field_0.m128[2] - (fVar39 * fVar47 + fVar21 * fVar42);
              auVar36._12_4_ = bi.upper.field_0.m128[3] - (fVar39 * fVar48 + fVar21 * fVar22);
              auVar30 = minps(auVar30,ZEXT816(0));
              auVar36 = maxps(auVar36,ZEXT816(0));
              auVar49._0_4_ = auVar49._0_4_ + auVar30._0_4_;
              auVar49._4_4_ = fVar51 + auVar30._4_4_;
              auVar49._8_4_ = fVar52 + auVar30._8_4_;
              auVar49._12_4_ = fVar53 + auVar30._12_4_;
              fVar54 = fVar54 + auVar30._0_4_;
              fVar55 = fVar55 + auVar30._4_4_;
              fVar56 = fVar56 + auVar30._8_4_;
              fVar57 = fVar57 + auVar30._12_4_;
              auVar44._0_4_ = auVar44._0_4_ + auVar36._0_4_;
              auVar44._4_4_ = fVar46 + auVar36._4_4_;
              auVar44._8_4_ = fVar47 + auVar36._8_4_;
              auVar44._12_4_ = fVar48 + auVar36._12_4_;
              fVar19 = fVar19 + auVar36._0_4_;
              fVar38 = fVar38 + auVar36._4_4_;
              fVar42 = fVar42 + auVar36._8_4_;
              fVar22 = fVar22 + auVar36._12_4_;
            }
          }
          auVar27._4_4_ = -(uint)(auVar49._4_4_ <= auVar44._4_4_);
          auVar27._0_4_ = -(uint)(auVar49._0_4_ <= auVar44._0_4_);
          auVar27._8_4_ = -(uint)(auVar49._8_4_ <= auVar44._8_4_);
          auVar27._12_4_ = -(uint)(auVar49._12_4_ <= auVar44._12_4_);
          uVar11 = movmskps(uVar11,auVar27);
          if (((~(byte)uVar11 & 7) == 0) &&
             (auVar28._4_4_ = -(uint)(fVar55 <= fVar38), auVar28._0_4_ = -(uint)(fVar54 <= fVar19),
             auVar28._8_4_ = -(uint)(fVar56 <= fVar42), auVar28._12_4_ = -(uint)(fVar57 <= fVar22),
             uVar11 = movmskps(CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11),auVar28),
             (~(byte)uVar11 & 7) == 0)) {
            auVar10._4_4_ = fVar55;
            auVar10._0_4_ = fVar54;
            auVar10._8_4_ = fVar56;
            auVar10._12_4_ = fVar57;
            auVar49 = minps(auVar49,auVar10);
            auVar9._4_4_ = fVar38;
            auVar9._0_4_ = fVar19;
            auVar9._8_4_ = fVar42;
            auVar9._12_4_ = fVar22;
            auVar44 = maxps(auVar44,auVar9);
            aVar50._0_12_ = auVar49._0_12_;
            aVar50.m128[3] = (float)geomID;
            aVar45._0_12_ = auVar44._0_12_;
            aVar45.m128[3] = (float)uVar18;
            auVar29._0_4_ = auVar49._0_4_ + auVar44._0_4_;
            auVar29._4_4_ = auVar49._4_4_ + auVar44._4_4_;
            auVar29._8_4_ = auVar49._8_4_ + auVar44._8_4_;
            auVar29._12_4_ = (float)geomID + (float)uVar18;
            local_138 = minps(local_138,(undefined1  [16])aVar50);
            local_128 = maxps(local_128,(undefined1  [16])aVar45);
            auVar35 = minps(auVar35,auVar29);
            auVar40 = maxps(auVar40,auVar29);
            local_160 = local_160 + 1;
            local_100[local_168].lower.field_0 = aVar50;
            local_100[local_168].upper.field_0 = aVar45;
            local_168 = local_168 + 1;
          }
        }
        else {
          lVar7 = *(long *)((long)pBVar5 + lVar14 + -0x10);
          lVar8 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar14);
          lVar16 = lVar8 * (ulong)uVar4;
          pfVar1 = (float *)(lVar7 + lVar16);
          auVar31._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
          auVar31._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
          auVar31._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
          auVar31._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
          auVar23._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
          auVar23._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
          auVar23._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
          auVar23._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
          iVar15 = movmskps((int)lVar16,auVar23 | auVar31);
          if (iVar15 == 0) {
            pfVar1 = (float *)(lVar7 + lVar8 * uVar17);
            auVar32._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
            auVar32._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
            auVar32._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
            auVar32._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
            auVar24._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
            auVar24._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
            auVar24._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
            auVar24._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
            iVar15 = movmskps((int)lVar7,auVar24 | auVar32);
            if (iVar15 == 0) {
              lVar7 = *(long *)((long)pBVar6 + lVar14 + -0x10);
              lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar14);
              lVar16 = lVar8 * (ulong)uVar4;
              pfVar1 = (float *)(lVar7 + lVar16);
              auVar33._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
              auVar33._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
              auVar33._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
              auVar33._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
              auVar25._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
              auVar25._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
              auVar25._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
              auVar25._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
              iVar15 = movmskps((int)lVar16,auVar25 | auVar33);
              if (iVar15 == 0) goto code_r0x00226c14;
            }
          }
        }
      }
LAB_00226c4d:
    }
    *(undefined8 *)
     &(local_f8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
         local_138._0_8_;
    *(undefined8 *)
     ((long)&(local_f8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 + 8)
         = local_138._8_8_;
    *(undefined8 *)
     &(local_f8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
         local_128._0_8_;
    *(undefined8 *)
     ((long)&(local_f8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 + 8)
         = local_128._8_8_;
    *(undefined1 (*) [16])
     (local_f8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128 =
         auVar35;
    *(undefined1 (*) [16])
     (local_f8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128 =
         auVar40;
    local_f8->end = local_160;
    __return_storage_ptr__ = local_f8;
  }
  return __return_storage_ptr__;
code_r0x00226c14:
  lVar14 = lVar14 + 0x38;
  pfVar1 = (float *)(lVar7 + lVar8 * uVar17);
  auVar34._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
  auVar34._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
  auVar34._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
  auVar34._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
  auVar26._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
  auVar26._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
  auVar26._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
  auVar26._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
  iVar15 = movmskps((int)lVar7,auVar26 | auVar34);
  if (iVar15 != 0) goto LAB_00226c4d;
  goto LAB_00226b92;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }